

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void websocket_write_impl
               (intptr_t fd,void *data,size_t len,char text,char first,char last,char client)

{
  fio_write_args_s options;
  uchar uVar1;
  void *target;
  uint64_t local_78;
  undefined1 local_38;
  undefined7 uStack_37;
  void *buff;
  char last_local;
  char first_local;
  size_t sStack_20;
  char text_local;
  size_t len_local;
  void *data_local;
  intptr_t fd_local;
  
  buff._6_1_ = first;
  sStack_20 = len;
  len_local = (size_t)data;
  if (len < 0x3001) {
    target = fio_malloc(len + 0x10);
    if (client == '\0') {
      uVar1 = '\x02';
      if (text != '\0') {
        uVar1 = '\x01';
      }
      local_78 = websocket_server_wrap(target,data,len,uVar1,first,last,'\0');
    }
    else {
      uVar1 = '\x02';
      if (text != '\0') {
        uVar1 = '\x01';
      }
      local_78 = websocket_client_wrap(target,data,len,uVar1,first,last,'\0');
    }
    options.after.dealloc = fio_free;
    options.data.buffer = target;
    options.length = local_78;
    options.offset = 0;
    options._32_8_ = CONCAT71(uStack_37,local_38) & 0xfffffffffffffff0;
    fio_write2_fn(fd,options);
  }
  else {
    for (; 0x3000 < sStack_20; sStack_20 = sStack_20 - 0x3000) {
      websocket_write_impl(fd,(void *)len_local,0x3000,text,buff._6_1_,'\0',client);
      len_local = len_local + 0x3000;
      buff._6_1_ = '\0';
    }
    websocket_write_impl(fd,(void *)len_local,sStack_20,text,buff._6_1_,'\x01',client);
  }
  return;
}

Assistant:

static void websocket_write_impl(intptr_t fd, void *data, size_t len, char text,
                                 char first, char last, char client) {
  if (len <= WS_MAX_FRAME_SIZE) {
    void *buff = fio_malloc(len + 16);
    len = (client ? websocket_client_wrap(buff, data, len, (text ? 1 : 2),
                                          first, last, 0)
                  : websocket_server_wrap(buff, data, len, (text ? 1 : 2),
                                          first, last, 0));
    fio_write2(fd, .data.buffer = buff, .length = len,
               .after.dealloc = fio_free);
  } else {
    /* frame fragmentation is better for large data then large frames */
    while (len > WS_MAX_FRAME_SIZE) {
      websocket_write_impl(fd, data, WS_MAX_FRAME_SIZE, text, first, 0, client);
      data = ((uint8_t *)data) + WS_MAX_FRAME_SIZE;
      first = 0;
      len -= WS_MAX_FRAME_SIZE;
    }
    websocket_write_impl(fd, data, len, text, first, 1, client);
  }
  return;
}